

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall
Clone_componentWithResetsAndVariables_Test::TestBody
          (Clone_componentWithResetsAndVariables_Test *this)

{
  string *psVar1;
  ComponentPtr cClone;
  ComponentPtr c;
  VariablePtr v4;
  VariablePtr v3;
  VariablePtr v2;
  ResetPtr r1;
  VariablePtr v1;
  ResetPtr r2;
  string asStack_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0 [3];
  string *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  undefined8 local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  string *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  string *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  string *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  string *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  shared_ptr *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  libcellml::Component::create();
  libcellml::Reset::create();
  libcellml::Reset::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  psVar1 = local_88;
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_a8,"unique",(allocator<char> *)&local_78);
  libcellml::Entity::setId(psVar1);
  std::__cxx11::string::~string(asStack_a8);
  psVar1 = local_88;
  std::__cxx11::string::string<std::allocator<char>>(asStack_a8,"copy",(allocator<char> *)&local_78)
  ;
  libcellml::NamedEntity::setName(psVar1);
  std::__cxx11::string::~string(asStack_a8);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_a8,"variable1",(allocator<char> *)&local_78);
  libcellml::NamedEntity::setName(local_28);
  std::__cxx11::string::~string(asStack_a8);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_a8,"variable2",(allocator<char> *)&local_78);
  libcellml::NamedEntity::setName(local_48);
  std::__cxx11::string::~string(asStack_a8);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_a8,"variable3",(allocator<char> *)&local_78);
  libcellml::NamedEntity::setName(local_58);
  std::__cxx11::string::~string(asStack_a8);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_a8,"variable4",(allocator<char> *)&local_78);
  libcellml::NamedEntity::setName(local_68);
  std::__cxx11::string::~string(asStack_a8);
  libcellml::Reset::setVariable(local_38);
  libcellml::Reset::setTestVariable(local_38);
  libcellml::Reset::setTestVariable(local_18);
  libcellml::Component::addVariable((shared_ptr *)local_88);
  libcellml::Component::addVariable((shared_ptr *)local_88);
  libcellml::Component::addVariable((shared_ptr *)local_88);
  libcellml::Component::addVariable((shared_ptr *)local_88);
  libcellml::Component::addReset((shared_ptr *)local_88);
  libcellml::Component::addReset((shared_ptr *)local_88);
  libcellml::Component::clone();
  local_78 = 0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  compareComponent((shared_ptr *)&local_88,(shared_ptr *)asStack_a8,(shared_ptr *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  return;
}

Assistant:

TEST(Clone, componentWithResetsAndVariables)
{
    auto c = libcellml::Component::create();
    auto r1 = libcellml::Reset::create();
    auto r2 = libcellml::Reset::create();
    auto v1 = libcellml::Variable::create();
    auto v2 = libcellml::Variable::create();
    auto v3 = libcellml::Variable::create();
    auto v4 = libcellml::Variable::create();

    c->setId("unique");
    c->setName("copy");

    v1->setName("variable1");
    v2->setName("variable2");
    v3->setName("variable3");
    v4->setName("variable4");

    r1->setVariable(v2);
    r1->setTestVariable(v3);

    r2->setTestVariable(v4);

    c->addVariable(v1);
    c->addVariable(v2);
    c->addVariable(v3);
    c->addVariable(v4);

    c->addReset(r1);
    c->addReset(r2);

    auto cClone = c->clone();

    compareComponent(c, cClone);
}